

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoggingTuples.cpp
# Opt level: O3

int main(void)

{
  long lVar1;
  pthread_mutex_t *ppVar2;
  __atomic_base<unsigned_long> _Var3;
  atomic<unsigned_long> aVar4;
  cx_string<2UL> cVar5;
  int iVar6;
  size_t sVar7;
  Session *pSVar8;
  undefined8 uVar9;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_00;
  basic_ostream<char,_std::char_traits<char>_> *out;
  basic_ostream<char,_std::char_traits<char>_> *extraout_RDX_01;
  long *in_FS_OFFSET;
  cx_string<10UL> cVar10;
  tuple<> empty;
  timespec ts_1;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
  t;
  pair<int,_char> p;
  tuple<> local_1f9;
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [8];
  _Alloc_hider _Stack_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c0;
  pair<int,_char> local_1a8;
  undefined1 local_1a0 [16];
  _Alloc_hider local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  _Alloc_hider local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  uint64_t local_130;
  _Alloc_hider local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Alloc_hider local_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  undefined1 local_e8 [16];
  _Alloc_hider local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  uint64_t local_78;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar8 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar8,0x100000,0,(string *)local_1d8);
    main_cold_1();
  }
  lVar1 = *in_FS_OFFSET;
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (main::_binlog_sid.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar8 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar8,0x100000,0,(string *)local_1d8);
        main_cold_2();
      }
      ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_e8._0_8_ = 0;
      local_e8._8_2_ = info;
      local_d8._M_p = (pointer)&local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"main","");
      local_b8._M_p = (pointer)&local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"main","");
      local_98._M_p = (pointer)&local_88;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingTuples.cpp"
                 ,"");
      local_78 = 0xc;
      local_70._M_p = (pointer)&local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Empty tuple: {}","");
      local_1f8._0_2_ = 0x28;
      local_1a8.first = CONCAT22(local_1a8.first._2_2_,0x29);
      cVar5 = mserialize::cx_strcat<1ul,1ul>
                        ((cx_string<1UL> *)local_1f8,(cx_string<1UL> *)&local_1a8);
      local_1d8 = (undefined1  [8])(CONCAT53(local_1d8._3_5_,cVar5._data) & 0xffffffffff00ffff);
      local_50._M_p = (pointer)&local_40;
      sVar7 = strlen(local_1d8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,local_1d8,local_1d8 + sVar7);
      iVar6 = pthread_mutex_lock(ppVar2);
      if (iVar6 != 0) {
        iVar6 = std::__throw_system_error(iVar6);
        goto LAB_00102d13;
      }
      local_e8._0_8_ = ppVar2[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_e8,(RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
      _Var3._M_i = ppVar2[3].__align;
      ppVar2[3].__align = _Var3._M_i + 1;
      pthread_mutex_unlock(ppVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_p != &local_40) {
        operator_delete(local_50._M_p,local_40._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p != &local_60) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p != &local_88) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_p != &local_a8) {
        operator_delete(local_b8._M_p,local_a8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_p != &local_c8) {
        operator_delete(local_d8._M_p,local_c8._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
    }
    aVar4.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar8 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar8,0x100000,0,(string *)local_1d8);
      main_cold_3();
    }
    local_1d8._0_4_ = (_Head_base<2UL,_int,_false>)0x0;
    local_1d8[4] = false;
    local_1d8._5_3_ = 0;
    _Stack_1d0._M_p = (pointer)0x0;
    clock_gettime(0,(timespec *)local_1d8);
    binlog::SessionWriter::addEvent<std::tuple<>&>
              ((SessionWriter *)(lVar1 + -0x38),
               (uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,
               (uint64_t)(_Stack_1d0._M_p + (long)local_1d8 * 1000000000),&local_1f9);
  }
  local_1a8.first = 1;
  local_1a8.second = 'a';
  local_1d8._0_5_ = 0x100000002;
  _Stack_1d0._M_p = (pointer)&local_1c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&_Stack_1d0,"foo","");
  out = extraout_RDX;
  if ((char)in_FS_OFFSET[-1] == '\0') {
    pSVar8 = binlog::default_session();
    binlog::detail::this_thread_id_string_abi_cxx11_();
    binlog::SessionWriter::SessionWriter
              ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar8,0x100000,0,(string *)local_1f8);
    if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
      operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
    }
    __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle);
    *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    out = extraout_RDX_01;
  }
  if (*(ushort *)(in_FS_OFFSET[-7] + 0x88) < 0x81) {
    if (main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i == 0) {
      if ((char)in_FS_OFFSET[-1] == '\0') {
        pSVar8 = binlog::default_session();
        binlog::detail::this_thread_id_string_abi_cxx11_();
        binlog::SessionWriter::SessionWriter
                  ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar8,0x100000,0,(string *)local_1f8);
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,
                            &__dso_handle);
        *(undefined1 *)(in_FS_OFFSET + -1) = 1;
      }
      ppVar2 = (pthread_mutex_t *)in_FS_OFFSET[-7];
      local_1a0._0_8_ = 0;
      local_1a0._8_2_ = info;
      local_190._M_p = (pointer)&local_180;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"main","");
      local_170._M_p = (pointer)&local_160;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"main","");
      local_150._M_p = (pointer)&local_140;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_150,
                 "/workspace/llm4binary/github/license_c_cmakelists/erenon[P]binlog/test/integration/LoggingTuples.cpp"
                 ,"");
      local_130 = 0x12;
      local_128._M_p = (pointer)&local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"Pair: {}, Tuple: {}","")
      ;
      cVar10 = binlog::detail::
               concatenated_tags<char_const(&)[20],std::pair<int,char>&,std::tuple<std::__cxx11::string,bool,int>&>
                         ((char (*) [20])"Pair: {}, Tuple: {}",&local_1a8,
                          (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
                           *)local_1d8);
      local_1f8._0_8_ = cVar10._data._0_8_;
      local_1f8._8_3_ = cVar10._data._8_3_;
      local_108._M_p = (pointer)&local_f8;
      sVar7 = strlen(local_1f8);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_108,local_1f8,local_1f8 + sVar7);
      iVar6 = pthread_mutex_lock(ppVar2);
      if (iVar6 != 0) {
LAB_00102d13:
        uVar9 = std::__throw_system_error(iVar6);
        if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
          operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Stack_1d0._M_p != &local_1c0) {
          operator_delete(_Stack_1d0._M_p,local_1c0._0_8_ + 1);
        }
        _Unwind_Resume(uVar9);
      }
      local_1a0._0_8_ = ppVar2[3].__align;
      binlog::
      serializeSizePrefixedTagged<binlog::EventSource,binlog::detail::RecoverableVectorOutputStream>
                ((EventSource *)local_1a0,(RecoverableVectorOutputStream *)((long)ppVar2 + 0x58));
      _Var3._M_i = ppVar2[3].__align;
      ppVar2[3].__align = _Var3._M_i + 1;
      pthread_mutex_unlock(ppVar2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_p != &local_f8) {
        operator_delete(local_108._M_p,local_f8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_p != &local_118) {
        operator_delete(local_128._M_p,local_118._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_p != &local_140) {
        operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_p != &local_160) {
        operator_delete(local_170._M_p,local_160._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_p != &local_180) {
        operator_delete(local_190._M_p,local_180._M_allocated_capacity + 1);
      }
      LOCK();
      UNLOCK();
      main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i =
           (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
    }
    aVar4.super___atomic_base<unsigned_long>._M_i =
         main::_binlog_sid_1.super___atomic_base<unsigned_long>._M_i;
    if ((char)in_FS_OFFSET[-1] == '\0') {
      pSVar8 = binlog::default_session();
      binlog::detail::this_thread_id_string_abi_cxx11_();
      binlog::SessionWriter::SessionWriter
                ((SessionWriter *)(*in_FS_OFFSET + -0x38),pSVar8,0x100000,0,(string *)local_1f8);
      if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
        operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
      }
      __cxa_thread_atexit(binlog::SessionWriter::~SessionWriter,*in_FS_OFFSET + -0x38,&__dso_handle)
      ;
      *(undefined1 *)(in_FS_OFFSET + -1) = 1;
    }
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = 0;
    clock_gettime(0,(timespec *)local_1f8);
    binlog::SessionWriter::addEvent<std::pair<int,char>&,std::tuple<std::__cxx11::string,bool,int>&>
              ((SessionWriter *)(lVar1 + -0x38),
               (uint64_t)aVar4.super___atomic_base<unsigned_long>._M_i,
               local_1f8._0_8_ * 1000000000 + local_1f8._8_8_,&local_1a8,
               (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_int>
                *)local_1d8);
    out = extraout_RDX_00;
  }
  binlog::consume<std::ostream>((ConsumeResult *)local_1f8,(binlog *)&std::cout,out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Stack_1d0._M_p != &local_1c0) {
    operator_delete(_Stack_1d0._M_p,local_1c0._0_8_ + 1);
  }
  return 0;
}

Assistant:

int main()
{
  std::tuple<> empty;
  BINLOG_INFO("Empty tuple: {}", empty);
  // Outputs: Empty tuple: ()

  //[stdtup
  std::pair<int, char> p{1, 'a'};
  std::tuple<std::string, bool, int> t{"foo", true, 2};
  BINLOG_INFO("Pair: {}, Tuple: {}", p, t);
  // Outputs: Pair: (1, a), Tuple: (foo, true, 2)
  //]

  binlog::consume(std::cout);
  return 0;
}